

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O2

Vector3d * __thiscall OpenMD::Snapshot::getHeatFlux(Vector3d *__return_storage_ptr__,Snapshot *this)

{
  Vector<double,_3U> VStack_68;
  Vector<double,_3U> local_50;
  Vector<double,_3U> local_38;
  
  Vector<double,_3U>::Vector
            (&local_50,&(this->frameData).conductiveHeatFlux.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector
            (&VStack_68,&(this->frameData).convectiveHeatFlux.super_Vector<double,_3U>);
  OpenMD::operator+(&local_38,&local_50,&VStack_68);
  Vector<double,_3U>::Vector(&__return_storage_ptr__->super_Vector<double,_3U>,&local_38);
  return __return_storage_ptr__;
}

Assistant:

Vector3d Snapshot::getHeatFlux() {
    // BE CAREFUL WITH UNITS
    return getConductiveHeatFlux() + getConvectiveHeatFlux();
  }